

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O1

XrResult ApiDumpLayerXrDestroySceneMSFT(XrSceneMSFT scene)

{
  long lVar1;
  XrResult XVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *in_RDI;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  unique_lock<std::mutex> lock;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  ostringstream oss_scene;
  _Hash_node_base *local_1f0;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  unique_lock<std::mutex> local_198;
  uint auStack_180 [22];
  ios_base local_128 [264];
  
  local_1c8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_198._M_device = &g_scenemsft_dispatch_mutex;
  local_198._M_owns = false;
  local_1f0 = in_RDI;
  std::unique_lock<std::mutex>::lock(&local_198);
  local_198._M_owns = true;
  p_Var4 = g_scenemsft_dispatch_map._M_h._M_buckets
           [(ulong)local_1f0 % g_scenemsft_dispatch_map._M_h._M_bucket_count];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var6 = p_Var4->_M_nxt, p_Var5 = p_Var4, local_1f0 != p_Var4->_M_nxt[1]._M_nxt)) {
    while (p_Var4 = p_Var6, p_Var6 = p_Var4->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var6[1]._M_nxt % g_scenemsft_dispatch_map._M_h._M_bucket_count !=
           (ulong)local_1f0 % g_scenemsft_dispatch_map._M_h._M_bucket_count) ||
         (p_Var5 = p_Var4, local_1f0 == p_Var6[1]._M_nxt)) goto LAB_00234ef3;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_00234ef3:
  if (p_Var5 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var5->_M_nxt;
  }
  if (p_Var6 == (_Hash_node_base *)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var6[2]._M_nxt;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_198);
  if (p_Var6 == (_Hash_node_base *)0x0) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[19],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_1c8,(char (*) [9])"XrResult",(char (*) [19])"xrDestroySceneMSFT",
               (char (*) [1])0x2a4b54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    lVar1 = *(long *)((long)&local_198._M_device[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_180 + lVar1) = *(uint *)((long)auStack_180 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&local_198);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[12],char_const(&)[6],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_1c8,(char (*) [12])"XrSceneMSFT",(char (*) [6])"scene",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._0_8_ != &local_1d8) {
      operator_delete((void *)local_1e8._0_8_,local_1d8._M_allocated_capacity + 1);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_1b0,&local_1c8);
    ApiDumpLayerRecordContent(&local_1b0);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_1b0);
    XVar2 = (*(code *)p_Var3[0x68]._M_nxt)(local_1f0);
    p_Var4 = g_scenemsft_dispatch_map._M_h._M_buckets
             [(ulong)local_1f0 % g_scenemsft_dispatch_map._M_h._M_bucket_count];
    p_Var5 = (__node_base_ptr)0x0;
    if ((p_Var4 != (__node_base_ptr)0x0) &&
       (p_Var6 = p_Var4->_M_nxt, p_Var5 = p_Var4, local_1f0 != p_Var4->_M_nxt[1]._M_nxt)) {
      while (p_Var4 = p_Var6, p_Var6 = p_Var4->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
        p_Var5 = (__node_base_ptr)0x0;
        if (((ulong)p_Var6[1]._M_nxt % g_scenemsft_dispatch_map._M_h._M_bucket_count !=
             (ulong)local_1f0 % g_scenemsft_dispatch_map._M_h._M_bucket_count) ||
           (p_Var5 = p_Var4, local_1f0 == p_Var6[1]._M_nxt)) goto LAB_0023504a;
      }
      p_Var5 = (__node_base_ptr)0x0;
    }
LAB_0023504a:
    if ((p_Var5 != (__node_base_ptr)0x0) && (p_Var5->_M_nxt != (_Hash_node_base *)0x0)) {
      local_1e8._0_8_ = &g_scenemsft_dispatch_mutex;
      local_1e8[8] = false;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1e8);
      local_1e8[8] = true;
      std::
      _Hashtable<XrSceneMSFT_T_*,_std::pair<XrSceneMSFT_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrSceneMSFT_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrSceneMSFT_T_*>,_std::hash<XrSceneMSFT_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&g_scenemsft_dispatch_map._M_h,&local_1f0);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1e8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1c8);
  return XVar2;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrDestroySceneMSFT(
    XrSceneMSFT scene) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_scenemsft_dispatch_mutex);
            auto map_iter = g_scenemsft_dispatch_map.find(scene);
            if (map_iter == g_scenemsft_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrDestroySceneMSFT", "");
        std::ostringstream oss_scene;
        oss_scene << std::hex << reinterpret_cast<const void*>(scene);
        contents.emplace_back("XrSceneMSFT", "scene", oss_scene.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->DestroySceneMSFT(scene);
        auto exists = g_scenemsft_dispatch_map.find(scene);
        if (exists != g_scenemsft_dispatch_map.end()) {
            std::unique_lock<std::mutex> lock(g_scenemsft_dispatch_mutex);
            g_scenemsft_dispatch_map.erase(scene);
        }
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}